

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,half *v)

{
  float fVar1;
  stringstream ss;
  stringstream asStack_1a8 [128];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(asStack_1a8);
  fVar1 = value::half_to_float((half)*(uint16_t *)this);
  ::std::ostream::_M_insert<double>((double)fVar1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(asStack_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::value::half &v) {
  std::stringstream ss;
  ss << v;
  return ss.str();
}